

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O1

int __thiscall
opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor::operator()
          (PollishCoefficientsFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double *pdVar1;
  Matrix<double,_20,_1,_0,_20,_1> monomials;
  assign_op<double,_double> local_111;
  Product<Eigen::Matrix<double,_10,_20,_0,_10,_20>,_Eigen::Matrix<double,_20,_1,_0,_20,_1>,_0>
  local_110;
  Matrix<double,_20,_1,_0,_20,_1> local_100;
  
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[0]
       = pow(*(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,
             3.0);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[1]
       = pow((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[1]
             ,3.0);
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[2]
       = *pdVar1 * *pdVar1 * pdVar1[1];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[3]
       = pdVar1[1] * pdVar1[1] * *pdVar1;
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[4]
       = *pdVar1 * *pdVar1 * pdVar1[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[5]
       = *pdVar1 * *pdVar1;
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[6]
       = pdVar1[1] * pdVar1[1] * pdVar1[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[7]
       = pdVar1[1] * pdVar1[1];
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[8]
       = *pdVar1 * pdVar1[1] * pdVar1[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[9]
       = *pdVar1 * pdVar1[1];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [10] = pdVar1[2] * pdVar1[2] * *pdVar1;
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xb] = *pdVar1 * pdVar1[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xc] = *pdVar1;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xd] = pdVar1[2] * pdVar1[2] * pdVar1[1];
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xe] = pdVar1[1] * pdVar1[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xf] = pdVar1[1];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x10] = pow(pdVar1[2],3.0);
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x11] = pdVar1[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x11] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data
           .array[0x11] *
           local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data
           .array[0x11];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x12] = pdVar1[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x13] = 1.0;
  local_110.m_lhs = this->_A;
  local_110.m_rhs = &local_100;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,10,20,0,10,20>,Eigen::Matrix<double,20,1,0,20,1>,0>,Eigen::internal::assign_op<double,double>>
            (fvec,&local_110,&local_111,(type)0x0);
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 3 );
    assert( (unsigned int) fvec.size() == 10);

    //create the monomials vector
    Eigen::Matrix<double,20,1> monomials;
    monomials[0] = pow(x[0],3);
    monomials[1] = pow(x[1],3);
    monomials[2] = pow(x[0],2)*x[1];
    monomials[3] = x[0]*pow(x[1],2);
    monomials[4] = pow(x[0],2)*x[2];
    monomials[5] = pow(x[0],2);
    monomials[6] = pow(x[1],2)*x[2];
    monomials[7] = pow(x[1],2);
    monomials[8] = x[0]*x[1]*x[2];
    monomials[9] = x[0]*x[1];
    monomials[10] = x[0]*pow(x[2],2);
    monomials[11] = x[0]*x[2];
    monomials[12] = x[0];
    monomials[13] = x[1]*pow(x[2],2);
    monomials[14] = x[1]*x[2];
    monomials[15] = x[1];
    monomials[16] = pow(x[2],3);
    monomials[17] = pow(x[2],2);
    monomials[18] = x[2];
    monomials[19] = 1.0;

    fvec = _A*monomials;

    return 0;
  }